

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_countSeqStoreLiteralsBytes(seqStore_t *seqStore)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = 0;
  for (uVar2 = 0; (long)seqStore->sequences - (long)seqStore->sequencesStart >> 3 != uVar2;
      uVar2 = uVar2 + 1) {
    sVar1 = sVar1 + seqStore->sequencesStart[uVar2].litLength;
    if ((uVar2 == seqStore->longLengthPos) && (seqStore->longLengthType == ZSTD_llt_literalLength))
    {
      sVar1 = sVar1 + 0x10000;
    }
  }
  return sVar1;
}

Assistant:

static size_t ZSTD_countSeqStoreLiteralsBytes(const seqStore_t* const seqStore)
{
    size_t literalsBytes = 0;
    size_t const nbSeqs = (size_t)(seqStore->sequences - seqStore->sequencesStart);
    size_t i;
    for (i = 0; i < nbSeqs; ++i) {
        seqDef const seq = seqStore->sequencesStart[i];
        literalsBytes += seq.litLength;
        if (i == seqStore->longLengthPos && seqStore->longLengthType == ZSTD_llt_literalLength) {
            literalsBytes += 0x10000;
    }   }
    return literalsBytes;
}